

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

int effectiveTextMargin(int defaultMargin,SideWidgetEntryList *widgets,
                       SideWidgetParameters *parameters)

{
  pointer pSVar1;
  bool bVar2;
  byte bVar3;
  QWidget *this;
  pointer pSVar5;
  int iVar6;
  difference_type __n;
  QWidget *pQVar4;
  
  pSVar5 = (widgets->
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (widgets->
           super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar5 != pSVar1) {
    iVar6 = 0;
    do {
      this = (QWidget *)QMetaObject::cast((QObject *)&QLineEditIconButton::staticMetaObject);
      pQVar4 = this;
      if (this != (QWidget *)0x0) {
        if (this[1].field_0x9 == '\0') {
          bVar2 = QWidget::isVisibleTo(this,*(QWidget **)(*(long *)&this->field_0x8 + 0x10));
          pQVar4 = (QWidget *)(ulong)bVar2;
        }
        else {
          pQVar4 = (QWidget *)0x0;
        }
      }
      bVar3 = (byte)pQVar4;
      if (this == (QWidget *)0x0) {
        bVar3 = QWidget::isVisibleTo
                          (pSVar5->widget,*(QWidget **)(*(long *)&pSVar5->widget->field_0x8 + 0x10))
        ;
      }
      iVar6 = iVar6 + (bVar3 & 1);
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
    defaultMargin = iVar6 * (parameters->widgetWidth + parameters->margin) + defaultMargin;
  }
  return defaultMargin;
}

Assistant:

static int effectiveTextMargin(int defaultMargin, const QLineEditPrivate::SideWidgetEntryList &widgets,
                               const QLineEditPrivate::SideWidgetParameters &parameters)
{
    if (widgets.empty())
        return defaultMargin;

    const auto visibleSideWidgetCount = std::count_if(widgets.begin(), widgets.end(),
                             [](const QLineEditPrivate::SideWidgetEntry &e) {
#if QT_CONFIG(toolbutton) && QT_CONFIG(animation)
        // a button that's fading out doesn't get any space
        if (auto* iconButton = qobject_cast<QLineEditIconButton*>(e.widget))
            return iconButton->needsSpace();

#endif
        return e.widget->isVisibleTo(e.widget->parentWidget());
    });

    return defaultMargin + (parameters.margin + parameters.widgetWidth) * visibleSideWidgetCount;
}